

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uraid.c
# Opt level: O2

int device_after_raid(void)

{
  uint __i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    LispReadFds.__fds_bits[lVar1] = 0;
  }
  set_cursor();
  init_keyboard(1);
  int_init();
  (*(currentdsp->device).after_raid)(currentdsp);
  LispReadFds.__fds_bits[*(int *)(currentdsp->display_id + 0x10) / 0x40] =
       LispReadFds.__fds_bits[*(int *)(currentdsp->display_id + 0x10) / 0x40] |
       1L << ((byte)*(int *)(currentdsp->display_id + 0x10) & 0x3f);
  flush_display_buffer();
  int_unblock();
  *EmKbdAd568K = 0xffff;
  *EmKbdAd468K = 0xffff;
  *EmKbdAd368K = 0xffff;
  *EmKbdAd268K = 0xffff;
  *EmKbdAd168K = 0xffff;
  *EmRealUtilin68K = 0xffff;
  *EmKbdAd068K = 0xffff;
  return 0;
}

Assistant:

int device_after_raid(void) {
  extern DLword *EmMouseX68K, *EmMouseY68K, *EmKbdAd068K, *EmRealUtilin68K;
  extern DLword *EmKbdAd168K, *EmKbdAd268K, *EmKbdAd368K, *EmKbdAd468K, *EmKbdAd568K;
  FD_ZERO(&LispReadFds);
  if (re_init_display(DISPLAY_OFFSET, 65536 * 16 * 2) == -1) return (-1);
  set_cursor();
  init_keyboard(1);

#ifdef TRUECOLOR
  truecolor_after_raid();
#endif /* TRUECOLOR */

#ifdef MAIKO_ENABLE_ETHERNET
  init_ether();
#if defined(USE_DLPI)
  if (ether_fd > 0)
    if (ioctl(ether_fd, I_SETSIG, S_INPUT) != 0) {
      perror("after-uraid: I_SETSIG for ether failed:\n");
      close(ether_fd);
      ether_fd = -1;
      return (-1);
    }
#endif /* USE_DLPI */
#endif /* MAIKO_ENABLE_ETHERNET */

#ifdef XWINDOW
#ifdef I_SETSIG
  if (ioctl(ConnectionNumber(currentdsp->display_id), I_SETSIG, S_INPUT) < 0)
    perror("SETSIG on X fd failed");
#endif /* I_SETSIG */
#endif /* XWINDOW */

  int_init();


#ifdef MAIKO_ENABLE_ETHERNET
  if (ether_fd > 0) FD_SET(ether_fd, &LispReadFds);
#endif /* MAIKO_ENABLE_ETHERNET */

#ifdef XWINDOW
  (currentdsp->device.after_raid)(currentdsp);
  FD_SET(ConnectionNumber(currentdsp->display_id), &LispReadFds);
  flush_display_buffer();
#elif DOS
  (currentdsp->device.after_raid)(currentdsp);
  (currentmouse->device.after_raid)(currentmouse, currentdsp);
  (currentkbd->device.after_raid)(currentkbd);
  flush_display_buffer();
#endif /* XWINDOW | DOS */

  int_unblock();
  *EmKbdAd068K = *EmRealUtilin68K = *EmKbdAd168K = *EmKbdAd268K = *EmKbdAd368K = *EmKbdAd468K =
      *EmKbdAd568K = KB_ALLUP;
  return (0);
}